

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits>::
get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_it,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_it,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_last)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  const_iterator item_last;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  bool local_41;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_18;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_10 [2];
  
  std::vector<char,_std::allocator<char>_>::cend(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )in_stack_ffffffffffffffa8);
    local_41 = false;
    if (bVar2) {
      local_41 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffffa8);
    }
    if (local_41 == false) break;
    pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(local_10);
    cVar1 = *pcVar3;
    pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_18);
    if (cVar1 == *pcVar3) {
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(&local_18);
      in_stack_ffffffffffffffb0 = in_RSI;
      __gnu_cxx::operator-
                ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                 in_RSI,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                         *)in_stack_ffffffffffffffa8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffffb0,(value_type_conflict *)in_stack_ffffffffffffffa8);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(local_10);
  }
  return;
}

Assistant:

void get_match_positions_greedy(std::vector<std::size_t>& posns,
                                  InputIt1 const item_first, InputIt1 item_it,
                                  InputIt2 query_it,
                                  InputIt2 const query_last) const {
    auto const item_last = item_.cend();
    while (item_it != item_last && query_it != query_last) {
      if (*item_it == *query_it) {
        ++query_it;
        posns.push_back(item_it - item_first);
      }
      ++item_it;
    }
  }